

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder * __thiscall
capnp::_::OrphanBuilder::referenceExternalData
          (OrphanBuilder *__return_storage_ptr__,OrphanBuilder *this,BuilderArena *arena,Reader data
          )

{
  unsigned_long uVar1;
  SegmentBuilder *pSVar2;
  ArrayPtr<const_capnp::word> content;
  Fault f;
  ThrowOverflow local_21;
  Fault local_20;
  
  if (((ulong)arena & 7) == 0) {
    uVar1 = assertMaxBits<29u,unsigned_long,kj::ThrowOverflow>
                      ((unsigned_long)data.super_ArrayPtr<const_unsigned_char>.ptr,&local_21);
    content.size_._0_4_ = (int)uVar1 + 7U >> 3;
    __return_storage_ptr__->location = (word *)0x0;
    __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
    __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)uVar1 * 8 + 2;
    content.ptr = (word *)arena;
    content.size_._4_4_ = 0;
    pSVar2 = BuilderArena::addExternalSegment((BuilderArena *)this,content);
    __return_storage_ptr__->segment = pSVar2;
    __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
    __return_storage_ptr__->location = (word *)arena;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xdb3,FAILED,"reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0",
             "\"Cannot referenceExternalData() that is not aligned.\"",
             (char (*) [52])"Cannot referenceExternalData() that is not aligned.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

OrphanBuilder OrphanBuilder::referenceExternalData(BuilderArena* arena, Data::Reader data) {
  // TODO(someday): We now allow unaligned segments on architectures thata support it. We could
  //   consider relaxing this check as well?
  KJ_REQUIRE(reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0,
             "Cannot referenceExternalData() that is not aligned.");

  auto checkedSize = assertMaxBits<BLOB_SIZE_BITS>(bounded(data.size()));
  auto wordCount = WireHelpers::roundBytesUpToWords(checkedSize * BYTES);
  kj::ArrayPtr<const word> words(reinterpret_cast<const word*>(data.begin()),
                                 unbound(wordCount / WORDS));

  OrphanBuilder result;
  result.tagAsPtr()->setKindForOrphan(WirePointer::LIST);
  result.tagAsPtr()->listRef.set(ElementSize::BYTE, checkedSize * ELEMENTS);
  result.segment = arena->addExternalSegment(words);

  // External data cannot possibly contain capabilities.
  result.capTable = nullptr;

  // const_cast OK here because we will check whether the segment is writable when we try to get
  // a builder.
  result.location = const_cast<word*>(words.begin());

  return result;
}